

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O0

int mg_session_ensure_space_for_chunk(mg_session *session,size_t chunk_size)

{
  ulong in_RSI;
  mg_session *in_RDI;
  char *new_in_buffer;
  void *in_stack_ffffffffffffffd8;
  mg_allocator *in_stack_ffffffffffffffe0;
  
  while( true ) {
    if (in_RSI <= in_RDI->in_capacity - in_RDI->in_end) {
      return 0;
    }
    in_stack_ffffffffffffffe0 =
         (mg_allocator *)
         mg_allocator_realloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x1079fd);
    if (in_stack_ffffffffffffffe0 == (mg_allocator *)0x0) break;
    in_RDI->in_capacity = in_RDI->in_capacity << 1;
    in_RDI->in_buffer = (char *)in_stack_ffffffffffffffe0;
  }
  mg_session_set_error(in_RDI,"failed to enlarge incoming message buffer");
  return -3;
}

Assistant:

int mg_session_ensure_space_for_chunk(mg_session *session, size_t chunk_size) {
  while (session->in_capacity - session->in_end < chunk_size) {
    char *new_in_buffer = mg_allocator_realloc(
        session->allocator, session->in_buffer, 2 * session->in_capacity);
    if (!new_in_buffer) {
      mg_session_set_error(session,
                           "failed to enlarge incoming message buffer");
      return MG_ERROR_OOM;
    }
    session->in_capacity = 2 * session->in_capacity;
    session->in_buffer = new_in_buffer;
  }
  return 0;
}